

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<int>::Add
          (RepeatedFieldWrapper<int> *this,Field *data,Value *value)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int tmp;
  
  iVar2 = (*(this->super_RandomAccessRepeatedFieldAccessor).super_RepeatedFieldAccessor.
            _vptr_RepeatedFieldAccessor[0x10])(this,value);
  uVar1 = *data;
  if (uVar1 == *(uint *)((long)data + 4)) {
    RepeatedField<int>::Reserve((RepeatedField<int> *)data,*(uint *)((long)data + 4) + 1);
  }
  piVar3 = RepeatedField<int>::elements((RepeatedField<int> *)data);
  piVar3[uVar1] = iVar2;
  *(uint *)data = uVar1 + 1;
  return;
}

Assistant:

void Add(Field* data, const Value* value) const override {
    MutableRepeatedField(data)->Add(ConvertToT(value));
  }